

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

VerifyDBResult __thiscall
CVerifyDB::VerifyDB(CVerifyDB *this,Chainstate *chainstate,Params *consensus_params,
                   CCoinsView *coinsview,int nCheckLevel,int nCheckDepth)

{
  int *args;
  long lVar1;
  pointer ppCVar2;
  Notifications *pNVar3;
  uint256 *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  DisconnectResult DVar13;
  int iVar14;
  ulong uVar15;
  size_t sVar16;
  CCoinsViewCache *this_00;
  size_t sVar17;
  CBlockIndex *index;
  int iVar18;
  CBlockIndex *pCVar19;
  VerifyDBResult VVar20;
  uchar *puVar21;
  CBlockIndex *pCVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  VerifyDBResult local_370;
  VerifyDBResult local_350;
  byte local_340;
  int percentageDone_1;
  int block_count;
  int local_324;
  int nCheckDepth_local;
  int nCheckLevel_local;
  CBlockUndo undo;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  string local_2d8;
  CBlock block;
  BlockValidationState state;
  CCoinsViewCache coins;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar2 = (chainstate->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar15 = (long)ppCVar2 -
           (long)(chainstate->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  VVar20 = SUCCESS;
  nCheckDepth_local = nCheckDepth;
  nCheckLevel_local = nCheckLevel;
  if (((uVar15 != 0) && (VVar20 = SUCCESS, ppCVar2[-1] != (CBlockIndex *)0x0)) &&
     (ppCVar2[-1]->pprev != (CBlockIndex *)0x0)) {
    if ((nCheckDepth < 1) || ((int)(uVar15 >> 3) <= nCheckDepth)) {
      nCheckDepth_local = (int)(uVar15 >> 3) + -1;
    }
    iVar18 = nCheckLevel;
    if (nCheckLevel < 1) {
      iVar18 = 0;
    }
    nCheckLevel_local = 4;
    if (nCheckLevel < 4) {
      nCheckLevel_local = iVar18;
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "VerifyDB";
    logging_function._M_len = 8;
    LogPrintFormatInternal<int,int>
              (logging_function,source_file,0x1260,ALL,Info,(ConstevalFormatString<2U>)0xfd4d4e,
               &nCheckDepth_local,&nCheckLevel_local);
    CCoinsViewCache::CCoinsViewCache(&coins,coinsview,false);
    local_324 = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
         '\0';
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "VerifyDB";
    logging_function_00._M_len = 8;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x1269,ALL,Info,
               (ConstevalFormatString<0U>)0xfd4d74);
    ppCVar2 = (chainstate->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar2 ==
        (chainstate->m_chain).vChain.
        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      index = (CBlockIndex *)0x0;
    }
    else {
      index = ppCVar2[-1];
    }
    if (index == (CBlockIndex *)0x0) {
      local_350 = SUCCESS;
      bVar7 = false;
      iVar18 = 0;
      pCVar19 = (CBlockIndex *)0x0;
    }
    else {
      bVar10 = (chainstate->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
               _M_payload.super__Optional_payload_base<uint256>._M_engaged;
      pCVar19 = (CBlockIndex *)0x0;
      iVar18 = 0;
      local_340 = 0;
      bVar7 = false;
      do {
        if (index->pprev == (CBlockIndex *)0x0) break;
        iVar14 = 100;
        if (3 < nCheckLevel_local) {
          iVar14 = 0x32;
        }
        uVar12 = (uint)((double)iVar14 *
                       ((double)(~index->nHeight +
                                (int)((ulong)((long)(chainstate->m_chain).vChain.
                                                                                                        
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(chainstate->m_chain).vChain.
                                                                                                      
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3))
                       / (double)nCheckDepth_local));
        if (0x62 < (int)uVar12) {
          uVar12 = 99;
        }
        uVar15 = (ulong)uVar12;
        if ((int)uVar12 < 2) {
          uVar15 = 1;
        }
        block_count = (int)uVar15;
        if (iVar18 < (int)(uVar15 * 0x1999999a >> 0x20)) {
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_01._M_len = 0x5e;
          logging_function_01._M_str = "VerifyDB";
          logging_function_01._M_len = 8;
          LogPrintFormatInternal<int>
                    (logging_function_01,source_file_01,0x1271,ALL,Info,
                     (ConstevalFormatString<1U>)0xfd4d90,&block_count);
          iVar18 = block_count / 10;
        }
        pNVar3 = this->m_notifications;
        block.super_CBlockHeader._0_8_ =
             block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&block,anon_var_dwarf_2c85c40,anon_var_dwarf_2c85c40 + 0x13);
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          block.super_CBlockHeader._32_8_ =
               block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems +
                     0x1c),anon_var_dwarf_2c85c40,anon_var_dwarf_2c85c40 + 0x13);
        }
        else {
          local_2d8._M_dataplus._M_p = anon_var_dwarf_2c85c40;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems +
                     0x1c),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_2d8);
        }
        (*pNVar3->_vptr_Notifications[4])(pNVar3,&block,(ulong)(uint)block_count,0);
        if ((uchar *)block.super_CBlockHeader._32_8_ !=
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) {
          operator_delete((void *)block.super_CBlockHeader._32_8_,
                          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data.
                          _M_elems._12_8_ + 1);
        }
        if ((uchar *)block.super_CBlockHeader._0_8_ !=
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc) {
          operator_delete((void *)block.super_CBlockHeader._0_8_,
                          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                          _M_elems._12_8_ + 1);
        }
        args = &index->nHeight;
        cVar9 = '\x02';
        if (~nCheckDepth_local +
            (int)((ulong)((long)(chainstate->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(chainstate->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3) < *args) {
          if (((chainstate->m_blockman->m_prune_mode | bVar10) == 1) && ((index->nStatus & 8) == 0))
          {
            local_340 = 1;
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_02._M_len = 0x5e;
            logging_function_02._M_str = "VerifyDB";
            logging_function_02._M_len = 8;
            LogPrintFormatInternal<int>
                      (logging_function_02,source_file_02,0x127b,ALL,Info,
                       (ConstevalFormatString<1U>)0xfd4dad,args);
          }
          else {
            block.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            block.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            block.super_CBlockHeader.nBits = 0;
            block.super_CBlockHeader.nNonce = 0;
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 '\0';
            block.super_CBlockHeader.nTime = 0;
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0'
            ;
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0'
            ;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0'
            ;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0'
            ;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0'
            ;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] =
                 '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0'
            ;
            block.super_CBlockHeader.nVersion = 0;
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            block.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            block.fChecked = false;
            block.m_checked_witness_commitment = false;
            block.m_checked_merkle_root = false;
            bVar11 = ::node::BlockManager::ReadBlockFromDisk(chainstate->m_blockman,&block,index);
            if (bVar11) {
              if ((0 < nCheckLevel_local) &&
                 (bVar11 = CheckBlock(&block,&state,consensus_params,true,true), !bVar11)) {
                puVar4 = index->phashBlock;
                if (puVar4 != (uint256 *)0x0) {
                  local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
                  uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
                  local_2e8 = *(undefined8 *)
                               ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
                  uStack_2e0 = *(undefined8 *)
                                ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
                  base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
                  ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                            ((string *)&undo,&state.super_ValidationState<BlockValidationResult>);
                  source_file_05._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ;
                  source_file_05._M_len = 0x5e;
                  logging_function_05._M_str = "VerifyDB";
                  logging_function_05._M_len = 8;
                  LogPrintFormatInternal<int,std::__cxx11::string,std::__cxx11::string>
                            (logging_function_05,source_file_05,0x1288,ALL,Info,
                             (ConstevalFormatString<3U>)0xfd4e6a,args,&local_2d8,(string *)&undo);
                  if (undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      (pointer)&undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(undo.vtxundo.
                                    super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (ulong)((long)&((undo.vtxundo.
                                                                                                          
                                                  super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->vprevout).
                                                  super__Vector_base<Coin,_std::allocator<Coin>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 1));
                  }
                  goto LAB_00afdd92;
                }
                goto LAB_00afe7ad;
              }
              if (nCheckLevel_local < 2) {
LAB_00afdeaa:
                sVar16 = CCoinsViewCache::DynamicMemoryUsage(&coins);
                this_00 = Chainstate::CoinsTip(chainstate);
                sVar17 = CCoinsViewCache::DynamicMemoryUsage(this_00);
                if (2 < nCheckLevel_local) {
                  if (chainstate->m_coinstip_cache_size_bytes < sVar17 + sVar16) {
                    bVar7 = true;
                  }
                  else {
                    CCoinsViewCache::GetBestBlock((uint256 *)&local_2d8,&coins);
                    puVar4 = index->phashBlock;
                    if (puVar4 == (uint256 *)0x0) goto LAB_00afe7ad;
                    local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
                    puVar5 = (puVar4->super_base_blob<256U>).m_data._M_elems + 8;
                    uStack_2f0 = *(undefined8 *)puVar5;
                    puVar21 = (puVar4->super_base_blob<256U>).m_data._M_elems + 0x10;
                    local_2e8 = *(undefined8 *)puVar21;
                    puVar6 = (puVar4->super_base_blob<256U>).m_data._M_elems + 0x18;
                    uStack_2e0 = *(undefined8 *)puVar6;
                    auVar24[0] = -(local_2d8.field_2._M_local_buf[0] == *puVar21);
                    auVar24[1] = -(local_2d8.field_2._M_local_buf[1] ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x11]);
                    auVar24[2] = -(local_2d8.field_2._M_local_buf[2] ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x12]);
                    auVar24[3] = -(local_2d8.field_2._M_local_buf[3] ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x13]);
                    auVar24[4] = -(local_2d8.field_2._M_local_buf[4] ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x14]);
                    auVar24[5] = -(local_2d8.field_2._M_local_buf[5] ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x15]);
                    auVar24[6] = -(local_2d8.field_2._M_local_buf[6] ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x16]);
                    auVar24[7] = -(local_2d8.field_2._M_local_buf[7] ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x17]);
                    auVar24[8] = -(local_2d8.field_2._M_local_buf[8] == *puVar6);
                    auVar24[9] = -(local_2d8.field_2._M_local_buf[9] ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[0x19]);
                    auVar24[10] = -(local_2d8.field_2._M_local_buf[10] ==
                                   (puVar4->super_base_blob<256U>).m_data._M_elems[0x1a]);
                    auVar24[0xb] = -(local_2d8.field_2._M_local_buf[0xb] ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1b]);
                    auVar24[0xc] = -(local_2d8.field_2._M_local_buf[0xc] ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1c]);
                    auVar24[0xd] = -(local_2d8.field_2._M_local_buf[0xd] ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1d]);
                    auVar24[0xe] = -(local_2d8.field_2._M_local_buf[0xe] ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1e]);
                    auVar24[0xf] = -(local_2d8.field_2._M_local_buf[0xf] ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0x1f]);
                    auVar23[0] = -((uchar)local_2d8._M_dataplus._M_p ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[0]);
                    auVar23[1] = -(local_2d8._M_dataplus._M_p._1_1_ ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[1]);
                    auVar23[2] = -(local_2d8._M_dataplus._M_p._2_1_ ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[2]);
                    auVar23[3] = -(local_2d8._M_dataplus._M_p._3_1_ ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[3]);
                    auVar23[4] = -(local_2d8._M_dataplus._M_p._4_1_ ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[4]);
                    auVar23[5] = -(local_2d8._M_dataplus._M_p._5_1_ ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[5]);
                    auVar23[6] = -(local_2d8._M_dataplus._M_p._6_1_ ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[6]);
                    auVar23[7] = -(local_2d8._M_dataplus._M_p._7_1_ ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[7]);
                    auVar23[8] = -((uchar)local_2d8._M_string_length == *puVar5);
                    auVar23[9] = -(local_2d8._M_string_length._1_1_ ==
                                  (puVar4->super_base_blob<256U>).m_data._M_elems[9]);
                    auVar23[10] = -(local_2d8._M_string_length._2_1_ ==
                                   (puVar4->super_base_blob<256U>).m_data._M_elems[10]);
                    auVar23[0xb] = -(local_2d8._M_string_length._3_1_ ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xb]);
                    auVar23[0xc] = -(local_2d8._M_string_length._4_1_ ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xc]);
                    auVar23[0xd] = -(local_2d8._M_string_length._5_1_ ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xd]);
                    auVar23[0xe] = -(local_2d8._M_string_length._6_1_ ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xe]);
                    auVar23[0xf] = -(local_2d8._M_string_length._7_1_ ==
                                    (puVar4->super_base_blob<256U>).m_data._M_elems[0xf]);
                    auVar23 = auVar23 & auVar24;
                    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) {
                      __assert_fail("coins.GetBestBlock() == pindex->GetBlockHash()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                    ,0x129a,
                                    "VerifyDBResult CVerifyDB::VerifyDB(Chainstate &, const Consensus::Params &, CCoinsView &, int, int)"
                                   );
                    }
                    DVar13 = Chainstate::DisconnectBlock(chainstate,&block,index,&coins);
                    if (DVar13 == DISCONNECT_FAILED) {
                      puVar4 = index->phashBlock;
                      if (puVar4 == (uint256 *)0x0) goto LAB_00afe7ad;
                      local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
                      uStack_2f0 = *(undefined8 *)
                                    ((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
                      local_2e8 = *(undefined8 *)
                                   ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
                      uStack_2e0 = *(undefined8 *)
                                    ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
                      base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
                      source_file_06._M_str =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ;
                      source_file_06._M_len = 0x5e;
                      logging_function_06._M_str = "VerifyDB";
                      logging_function_06._M_len = 8;
                      LogPrintFormatInternal<int,std::__cxx11::string>
                                (logging_function_06,source_file_06,0x129d,ALL,Info,
                                 (ConstevalFormatString<2U>)0xfd4f6e,args,&local_2d8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                        operator_delete(local_2d8._M_dataplus._M_p,
                                        CONCAT17(local_2d8.field_2._M_local_buf[7],
                                                 CONCAT16(local_2d8.field_2._M_local_buf[6],
                                                          CONCAT15(local_2d8.field_2._M_local_buf[5]
                                                                   ,CONCAT14(local_2d8.field_2.
                                                                             _M_local_buf[4],
                                                                             CONCAT13(local_2d8.
                                                                                      field_2.
                                                  _M_local_buf[3],
                                                  CONCAT12(local_2d8.field_2._M_local_buf[2],
                                                           CONCAT11(local_2d8.field_2._M_local_buf
                                                                    [1],local_2d8.field_2.
                                                                        _M_local_buf[0]))))))) + 1);
                      }
                      local_370 = CORRUPTED_BLOCK_DB;
                      pCVar22 = pCVar19;
                      iVar14 = local_324;
                    }
                    else {
                      pCVar22 = index;
                      iVar14 = 0;
                      if (DVar13 != DISCONNECT_UNCLEAN) {
                        pCVar22 = pCVar19;
                        iVar14 = (int)((ulong)((long)block.vtx.
                                                                                                          
                                                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)block.vtx.
                                                                                                        
                                                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) +
                                 local_324;
                      }
                    }
                    local_324 = iVar14;
                    cVar9 = true;
                    pCVar19 = pCVar22;
                    if (DVar13 == DISCONNECT_FAILED) goto LAB_00afe087;
                  }
                }
                cVar9 = util::SignalInterrupt::operator_cast_to_bool
                                  (chainstate->m_chainman->m_interrupt);
                if ((bool)cVar9) {
                  local_370 = INTERRUPTED;
                }
              }
              else {
                undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bVar11 = true;
                if ((((index->nStatus & 0x10) != 0) && (index->nFile != -1)) &&
                   (bVar8 = ::node::BlockManager::UndoReadFromDisk
                                      (chainstate->m_blockman,&undo,index), !bVar8)) {
                  puVar4 = index->phashBlock;
                  if (puVar4 == (uint256 *)0x0) goto LAB_00afe7ad;
                  local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
                  uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
                  local_2e8 = *(undefined8 *)
                               ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
                  uStack_2e0 = *(undefined8 *)
                                ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
                  base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
                  source_file_03._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ;
                  source_file_03._M_len = 0x5e;
                  logging_function_03._M_str = "VerifyDB";
                  logging_function_03._M_len = 8;
                  LogPrintFormatInternal<int,std::__cxx11::string>
                            (logging_function_03,source_file_03,0x1290,ALL,Info,
                             (ConstevalFormatString<2U>)0xfd4ea3,args,&local_2d8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                    operator_delete(local_2d8._M_dataplus._M_p,
                                    CONCAT17(local_2d8.field_2._M_local_buf[7],
                                             CONCAT16(local_2d8.field_2._M_local_buf[6],
                                                      CONCAT15(local_2d8.field_2._M_local_buf[5],
                                                               CONCAT14(local_2d8.field_2.
                                                                        _M_local_buf[4],
                                                                        CONCAT13(local_2d8.field_2.
                                                                                 _M_local_buf[3],
                                                                                 CONCAT12(local_2d8.
                                                                                          field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(local_2d8.field_2._M_local_buf[1],
                                                           local_2d8.field_2._M_local_buf[0])))))))
                                    + 1);
                  }
                  local_370 = CORRUPTED_BLOCK_DB;
                  bVar11 = false;
                }
                std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&undo.vtxundo);
                cVar9 = true;
                if (bVar11) goto LAB_00afdeaa;
              }
            }
            else {
              puVar4 = index->phashBlock;
              if (puVar4 == (uint256 *)0x0) goto LAB_00afe7ad;
              local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
              uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
              local_2e8 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
              uStack_2e0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
              base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_04._M_len = 0x5e;
              logging_function_04._M_str = "VerifyDB";
              logging_function_04._M_len = 8;
              LogPrintFormatInternal<int,std::__cxx11::string>
                        (logging_function_04,source_file_04,0x1282,ALL,Info,
                         (ConstevalFormatString<2U>)0xfd4e2d,args,&local_2d8);
LAB_00afdd92:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                operator_delete(local_2d8._M_dataplus._M_p,
                                CONCAT17(local_2d8.field_2._M_local_buf[7],
                                         CONCAT16(local_2d8.field_2._M_local_buf[6],
                                                  CONCAT15(local_2d8.field_2._M_local_buf[5],
                                                           CONCAT14(local_2d8.field_2._M_local_buf
                                                                    [4],CONCAT13(local_2d8.field_2.
                                                                                 _M_local_buf[3],
                                                                                 CONCAT12(local_2d8.
                                                                                          field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(local_2d8.field_2._M_local_buf[1],
                                                           local_2d8.field_2._M_local_buf[0])))))))
                                + 1);
              }
              cVar9 = true;
              local_370 = CORRUPTED_BLOCK_DB;
            }
LAB_00afe087:
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::~vector(&block.vtx);
          }
        }
        if (cVar9 != '\0') {
          if (cVar9 != '\x02') goto LAB_00afe69d;
          break;
        }
        index = index->pprev;
      } while (index != (CBlockIndex *)0x0);
      local_350 = (uint)local_340 << 2;
    }
    if (pCVar19 == (CBlockIndex *)0x0) {
      if (bVar7) {
        source_file_08._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_08._M_len = 0x5e;
        logging_function_08._M_str = "VerifyDB";
        logging_function_08._M_len = 8;
        LogPrintFormatInternal<>
                  (logging_function_08,source_file_08,0x12b1,ALL,Info,
                   (ConstevalFormatString<0U>)0xfd5028);
      }
      block_count = ~index->nHeight +
                    (int)((ulong)((long)(chainstate->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(chainstate->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (nCheckLevel_local < 4 || bVar7) {
LAB_00afe1bd:
        source_file_09._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_09._M_len = 0x5e;
        logging_function_09._M_str = "VerifyDB";
        logging_function_09._M_len = 8;
        LogPrintFormatInternal<int,int>
                  (logging_function_09,source_file_09,0x12cf,ALL,Info,
                   (ConstevalFormatString<2U>)0xfd50d0,&block_count,&local_324);
        local_370 = local_350;
        if (bVar7) {
          local_370 = SKIPPED_L3_CHECKS;
        }
      }
      else {
        do {
          puVar21 = block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems +
                    0xc;
          ppCVar2 = (chainstate->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar15 = (long)ppCVar2 -
                   (long)(chainstate->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar15 == 0) {
            pCVar19 = (CBlockIndex *)0x0;
          }
          else {
            pCVar19 = ppCVar2[-1];
          }
          if (index == pCVar19) goto LAB_00afe1bd;
          iVar14 = (int)(((double)(~index->nHeight + (int)(uVar15 >> 3)) / (double)nCheckDepth_local
                         ) * 50.0);
          uVar12 = 100 - iVar14;
          uVar15 = (ulong)uVar12;
          if ((int)uVar12 < 2) {
            uVar15 = 1;
          }
          if (iVar14 < 2) {
            uVar15 = 99;
          }
          percentageDone_1 = (int)uVar15;
          if (iVar18 < (int)(uint)(uVar15 * 0x66666667 >> 0x22)) {
            source_file_10._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_10._M_len = 0x5e;
            logging_function_10._M_str = "VerifyDB";
            logging_function_10._M_len = 8;
            LogPrintFormatInternal<int>
                      (logging_function_10,source_file_10,0x12bd,ALL,Info,
                       (ConstevalFormatString<1U>)0xfd4d90,&percentageDone_1);
            iVar18 = percentageDone_1 / 10;
          }
          pNVar3 = this->m_notifications;
          block.super_CBlockHeader._0_8_ = puVar21;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&block,anon_var_dwarf_2c85c40,anon_var_dwarf_2c85c40 + 0x13);
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            block.super_CBlockHeader._32_8_ =
                 block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc
            ;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                       + 0x1c),anon_var_dwarf_2c85c40,anon_var_dwarf_2c85c40 + 0x13);
          }
          else {
            local_2d8._M_dataplus._M_p = anon_var_dwarf_2c85c40;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                       + 0x1c),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_2d8);
          }
          (*pNVar3->_vptr_Notifications[4])(pNVar3,&block,(ulong)(uint)percentageDone_1,0);
          if ((uchar *)block.super_CBlockHeader._32_8_ !=
              block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) {
            operator_delete((void *)block.super_CBlockHeader._32_8_,
                            block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data.
                            _M_elems._12_8_ + 1);
          }
          if ((uchar *)block.super_CBlockHeader._0_8_ != puVar21) {
            operator_delete((void *)block.super_CBlockHeader._0_8_,
                            block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                            _M_elems._12_8_ + 1);
          }
          index = CChain::Next(&chainstate->m_chain,index);
          block.vtx.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          block.vtx.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          block.super_CBlockHeader.nBits = 0;
          block.super_CBlockHeader.nNonce = 0;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0'
          ;
          block.super_CBlockHeader.nTime = 0;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0'
          ;
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          block.super_CBlockHeader.nVersion = 0;
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          block.vtx.
          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          block.fChecked = false;
          block.m_checked_witness_commitment = false;
          block.m_checked_merkle_root = false;
          bVar10 = ::node::BlockManager::ReadBlockFromDisk(chainstate->m_blockman,&block,index);
          if (bVar10) {
            bVar10 = Chainstate::ConnectBlock(chainstate,&block,&state,index,&coins,false);
            if (!bVar10) {
              puVar4 = index->phashBlock;
              if (puVar4 != (uint256 *)0x0) {
                local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
                uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
                local_2e8 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
                uStack_2e0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18)
                ;
                base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
                ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                          ((string *)&undo,&state.super_ValidationState<BlockValidationResult>);
                source_file_12._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                ;
                source_file_12._M_len = 0x5e;
                logging_function_12._M_str = "VerifyDB";
                logging_function_12._M_len = 8;
                LogPrintFormatInternal<int,std::__cxx11::string,std::__cxx11::string>
                          (logging_function_12,source_file_12,0x12c8,ALL,Info,
                           (ConstevalFormatString<3U>)0xfd508d,&index->nHeight,&local_2d8,
                           (string *)&undo);
                if (undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    (pointer)&undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  operator_delete(undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (ulong)((long)&((undo.vtxundo.
                                                                                                      
                                                  super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->vprevout).
                                                 super__Vector_base<Coin,_std::allocator<Coin>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + 1));
                }
                goto LAB_00afe63c;
              }
              goto LAB_00afe7ad;
            }
            bVar11 = util::SignalInterrupt::operator_cast_to_bool
                               (chainstate->m_chainman->m_interrupt);
            bVar10 = !bVar11;
            if (bVar11) {
              local_370 = INTERRUPTED;
            }
          }
          else {
            puVar4 = index->phashBlock;
            if (puVar4 == (uint256 *)0x0) {
LAB_00afe7ad:
              __assert_fail("phashBlock != nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                            ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
            }
            local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
            uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
            local_2e8 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
            uStack_2e0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
            base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
            source_file_11._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_11._M_len = 0x5e;
            logging_function_11._M_str = "VerifyDB";
            logging_function_11._M_len = 8;
            LogPrintFormatInternal<int,std::__cxx11::string>
                      (logging_function_11,source_file_11,0x12c4,ALL,Info,
                       (ConstevalFormatString<2U>)0xfd4e2d,&index->nHeight,&local_2d8);
LAB_00afe63c:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,
                              CONCAT17(local_2d8.field_2._M_local_buf[7],
                                       CONCAT16(local_2d8.field_2._M_local_buf[6],
                                                CONCAT15(local_2d8.field_2._M_local_buf[5],
                                                         CONCAT14(local_2d8.field_2._M_local_buf[4],
                                                                  CONCAT13(local_2d8.field_2.
                                                                           _M_local_buf[3],
                                                                           CONCAT12(local_2d8.
                                                                                    field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(local_2d8.field_2._M_local_buf[1],
                                                           local_2d8.field_2._M_local_buf[0])))))))
                              + 1);
            }
            local_370 = CORRUPTED_BLOCK_DB;
            bVar10 = false;
          }
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&block.vtx);
        } while (bVar10);
      }
    }
    else {
      block.super_CBlockHeader.nVersion =
           (int)((ulong)((long)(chainstate->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(chainstate->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - pCVar19->nHeight;
      source_file_07._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_07._M_len = 0x5e;
      logging_function_07._M_str = "VerifyDB";
      logging_function_07._M_len = 8;
      LogPrintFormatInternal<int,int>
                (logging_function_07,source_file_07,0x12ad,ALL,Info,
                 (ConstevalFormatString<2U>)0xfd4fbc,(int *)&block,&local_324);
      local_370 = CORRUPTED_BLOCK_DB;
    }
LAB_00afe69d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
        &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_reject_reason.field_2._M_local_buf[0]) + 1);
    }
    coins.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
         (_func_int **)&PTR_GetCoin_013bb490;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&coins.cacheCoins._M_h);
    if (coins.m_sentinel.second.m_flags != '\0') {
      ((coins.m_sentinel.second.m_next)->second).m_prev = coins.m_sentinel.second.m_prev;
      ((coins.m_sentinel.second.m_prev)->second).m_next = coins.m_sentinel.second.m_next;
      coins.m_sentinel.second.m_flags = '\0';
    }
    if (0x1c < coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
      free(coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
           indirect);
      coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
      indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource(&coins.m_cache_coins_memory_resource);
    VVar20 = local_370;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return VVar20;
  }
  __stack_chk_fail();
}

Assistant:

VerifyDBResult CVerifyDB::VerifyDB(
    Chainstate& chainstate,
    const Consensus::Params& consensus_params,
    CCoinsView& coinsview,
    int nCheckLevel, int nCheckDepth)
{
    AssertLockHeld(cs_main);

    if (chainstate.m_chain.Tip() == nullptr || chainstate.m_chain.Tip()->pprev == nullptr) {
        return VerifyDBResult::SUCCESS;
    }

    // Verify blocks in the best chain
    if (nCheckDepth <= 0 || nCheckDepth > chainstate.m_chain.Height()) {
        nCheckDepth = chainstate.m_chain.Height();
    }
    nCheckLevel = std::max(0, std::min(4, nCheckLevel));
    LogPrintf("Verifying last %i blocks at level %i\n", nCheckDepth, nCheckLevel);
    CCoinsViewCache coins(&coinsview);
    CBlockIndex* pindex;
    CBlockIndex* pindexFailure = nullptr;
    int nGoodTransactions = 0;
    BlockValidationState state;
    int reportDone = 0;
    bool skipped_no_block_data{false};
    bool skipped_l3_checks{false};
    LogPrintf("Verification progress: 0%%\n");

    const bool is_snapshot_cs{chainstate.m_from_snapshot_blockhash};

    for (pindex = chainstate.m_chain.Tip(); pindex && pindex->pprev; pindex = pindex->pprev) {
        const int percentageDone = std::max(1, std::min(99, (int)(((double)(chainstate.m_chain.Height() - pindex->nHeight)) / (double)nCheckDepth * (nCheckLevel >= 4 ? 50 : 100))));
        if (reportDone < percentageDone / 10) {
            // report every 10% step
            LogPrintf("Verification progress: %d%%\n", percentageDone);
            reportDone = percentageDone / 10;
        }
        m_notifications.progress(_("Verifying blocks…"), percentageDone, false);
        if (pindex->nHeight <= chainstate.m_chain.Height() - nCheckDepth) {
            break;
        }
        if ((chainstate.m_blockman.IsPruneMode() || is_snapshot_cs) && !(pindex->nStatus & BLOCK_HAVE_DATA)) {
            // If pruning or running under an assumeutxo snapshot, only go
            // back as far as we have data.
            LogPrintf("VerifyDB(): block verification stopping at height %d (no data). This could be due to pruning or use of an assumeutxo snapshot.\n", pindex->nHeight);
            skipped_no_block_data = true;
            break;
        }
        CBlock block;
        // check level 0: read from disk
        if (!chainstate.m_blockman.ReadBlockFromDisk(block, *pindex)) {
            LogPrintf("Verification error: ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
            return VerifyDBResult::CORRUPTED_BLOCK_DB;
        }
        // check level 1: verify block validity
        if (nCheckLevel >= 1 && !CheckBlock(block, state, consensus_params)) {
            LogPrintf("Verification error: found bad block at %d, hash=%s (%s)\n",
                      pindex->nHeight, pindex->GetBlockHash().ToString(), state.ToString());
            return VerifyDBResult::CORRUPTED_BLOCK_DB;
        }
        // check level 2: verify undo validity
        if (nCheckLevel >= 2 && pindex) {
            CBlockUndo undo;
            if (!pindex->GetUndoPos().IsNull()) {
                if (!chainstate.m_blockman.UndoReadFromDisk(undo, *pindex)) {
                    LogPrintf("Verification error: found bad undo data at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                    return VerifyDBResult::CORRUPTED_BLOCK_DB;
                }
            }
        }
        // check level 3: check for inconsistencies during memory-only disconnect of tip blocks
        size_t curr_coins_usage = coins.DynamicMemoryUsage() + chainstate.CoinsTip().DynamicMemoryUsage();

        if (nCheckLevel >= 3) {
            if (curr_coins_usage <= chainstate.m_coinstip_cache_size_bytes) {
                assert(coins.GetBestBlock() == pindex->GetBlockHash());
                DisconnectResult res = chainstate.DisconnectBlock(block, pindex, coins);
                if (res == DISCONNECT_FAILED) {
                    LogPrintf("Verification error: irrecoverable inconsistency in block data at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                    return VerifyDBResult::CORRUPTED_BLOCK_DB;
                }
                if (res == DISCONNECT_UNCLEAN) {
                    nGoodTransactions = 0;
                    pindexFailure = pindex;
                } else {
                    nGoodTransactions += block.vtx.size();
                }
            } else {
                skipped_l3_checks = true;
            }
        }
        if (chainstate.m_chainman.m_interrupt) return VerifyDBResult::INTERRUPTED;
    }
    if (pindexFailure) {
        LogPrintf("Verification error: coin database inconsistencies found (last %i blocks, %i good transactions before that)\n", chainstate.m_chain.Height() - pindexFailure->nHeight + 1, nGoodTransactions);
        return VerifyDBResult::CORRUPTED_BLOCK_DB;
    }
    if (skipped_l3_checks) {
        LogPrintf("Skipped verification of level >=3 (insufficient database cache size). Consider increasing -dbcache.\n");
    }

    // store block count as we move pindex at check level >= 4
    int block_count = chainstate.m_chain.Height() - pindex->nHeight;

    // check level 4: try reconnecting blocks
    if (nCheckLevel >= 4 && !skipped_l3_checks) {
        while (pindex != chainstate.m_chain.Tip()) {
            const int percentageDone = std::max(1, std::min(99, 100 - (int)(((double)(chainstate.m_chain.Height() - pindex->nHeight)) / (double)nCheckDepth * 50)));
            if (reportDone < percentageDone / 10) {
                // report every 10% step
                LogPrintf("Verification progress: %d%%\n", percentageDone);
                reportDone = percentageDone / 10;
            }
            m_notifications.progress(_("Verifying blocks…"), percentageDone, false);
            pindex = chainstate.m_chain.Next(pindex);
            CBlock block;
            if (!chainstate.m_blockman.ReadBlockFromDisk(block, *pindex)) {
                LogPrintf("Verification error: ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                return VerifyDBResult::CORRUPTED_BLOCK_DB;
            }
            if (!chainstate.ConnectBlock(block, state, pindex, coins)) {
                LogPrintf("Verification error: found unconnectable block at %d, hash=%s (%s)\n", pindex->nHeight, pindex->GetBlockHash().ToString(), state.ToString());
                return VerifyDBResult::CORRUPTED_BLOCK_DB;
            }
            if (chainstate.m_chainman.m_interrupt) return VerifyDBResult::INTERRUPTED;
        }
    }

    LogPrintf("Verification: No coin database inconsistencies in last %i blocks (%i transactions)\n", block_count, nGoodTransactions);

    if (skipped_l3_checks) {
        return VerifyDBResult::SKIPPED_L3_CHECKS;
    }
    if (skipped_no_block_data) {
        return VerifyDBResult::SKIPPED_MISSING_BLOCKS;
    }
    return VerifyDBResult::SUCCESS;
}